

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O1

ALLEGRO_USTR * al_ustr_new_from_utf16(uint16_t *s)

{
  ushort uVar1;
  _al_bstring us;
  ulong uVar2;
  int iVar3;
  uint c;
  
  us = _al_bfromcstr("");
  uVar2 = 0;
  while( true ) {
    uVar1 = s[uVar2];
    c = (uint)uVar1;
    if ((ushort)(uVar1 + 0x2000) < 0xf800) {
      iVar3 = 1;
    }
    else {
      c = (uVar1 & 0x3bf) * 0x400 + (s[uVar2 + 1] & 0x3ff) + 0x10000;
      iVar3 = 2;
    }
    if (c == 0) break;
    al_ustr_append_chr(us,c);
    uVar2 = (ulong)(uint)((int)uVar2 + iVar3);
  }
  return us;
}

Assistant:

ALLEGRO_USTR *al_ustr_new_from_utf16(uint16_t const *s)
{
   unsigned int i = 0;
   ALLEGRO_USTR *ustr = al_ustr_new("");
   while (1) {
      int c;
      /* We expect the passed string to be 0 terminated, so there are
       * always 2 words available.
       */
      size_t n = _al_utf16_get(s + i, 2, &c);
      /* Note: The string already is 0 terminated. */
      if (c == 0)
         break;
      al_ustr_append_chr(ustr, c);
      i += n;
   }
   return ustr;
}